

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.h
# Opt level: O0

binarydata *
NetworkDataType::
serializedata<unsigned_char_const,unsigned_char_const,unsigned_short_const,unsigned_short_const,unsigned_short_const,unsigned_short_const,unsigned_short_const,unsigned_char_const,unsigned_short_const,unsigned_char_const,unsigned_short_const,unsigned_short_const,unsigned_short_const,unsigned_short_const>
          (uchar *args,uchar *args_1,unsigned_short *args_2,unsigned_short *args_3,
          unsigned_short *args_4,unsigned_short *args_5,unsigned_short *args_6,uchar *args_7,
          unsigned_short *args_8,uchar *args_9,unsigned_short *args_10,unsigned_short *args_11,
          unsigned_short *args_12,unsigned_short *args_13)

{
  Options OVar1;
  binarydata *in_RDI;
  string *in_stack_00000008;
  binarydata *in_stack_00000010;
  PortableBinaryOutputArchive archive;
  ostringstream stream;
  Options *in_stack_fffffffffffffcb0;
  ostream *in_stack_fffffffffffffcb8;
  PortableBinaryOutputArchive *in_stack_fffffffffffffcc0;
  binarydata *args_3_00;
  undefined7 in_stack_fffffffffffffcd8;
  uchar *in_stack_fffffffffffffce0;
  uchar *in_stack_fffffffffffffce8;
  OutputArchive<cereal::PortableBinaryOutputArchive,_1U> *in_stack_fffffffffffffcf0;
  unsigned_short *in_stack_fffffffffffffd30;
  unsigned_short *in_stack_fffffffffffffd38;
  uchar *in_stack_fffffffffffffd40;
  unsigned_short *in_stack_fffffffffffffd48;
  uchar *in_stack_fffffffffffffd50;
  unsigned_short *in_stack_fffffffffffffd58;
  unsigned_short *in_stack_fffffffffffffd60;
  unsigned_short *in_stack_fffffffffffffd68;
  unsigned_short *in_stack_fffffffffffffd70;
  ostringstream local_1d8 [424];
  
  args_3_00 = in_RDI;
  std::__cxx11::ostringstream::ostringstream(local_1d8);
  OVar1 = cereal::PortableBinaryOutputArchive::Options::Default();
  cereal::PortableBinaryOutputArchive::PortableBinaryOutputArchive
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0);
  cereal::OutputArchive<cereal::PortableBinaryOutputArchive,1u>::operator()
            (in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
             (unsigned_short *)CONCAT17(OVar1.itsOutputEndianness,in_stack_fffffffffffffcd8),
             (unsigned_short *)args_3_00,(unsigned_short *)in_RDI,in_stack_fffffffffffffd30,
             in_stack_fffffffffffffd38,in_stack_fffffffffffffd40,in_stack_fffffffffffffd48,
             in_stack_fffffffffffffd50,in_stack_fffffffffffffd58,in_stack_fffffffffffffd60,
             in_stack_fffffffffffffd68,in_stack_fffffffffffffd70);
  std::__cxx11::ostringstream::str();
  binarydata::binarydata(in_stack_00000010,in_stack_00000008);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffce0);
  cereal::PortableBinaryOutputArchive::~PortableBinaryOutputArchive
            ((PortableBinaryOutputArchive *)0x212abe);
  std::__cxx11::ostringstream::~ostringstream(local_1d8);
  return args_3_00;
}

Assistant:

static binarydata serializedata(T & ... args){
        std::ostringstream stream;
        cereal::PortableBinaryOutputArchive archive(stream);
        archive(args...);
        return binarydata(stream.str());
    }